

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O2

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::LoopInvariantCodeMotionCase::generateProgramData
          (ProgramData *__return_storage_ptr__,LoopInvariantCodeMotionCase *this,bool optimized)

{
  int iVar1;
  int iVar2;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string precision;
  string statements;
  float local_1c4;
  string local_1c0;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar2 = 0;
  iVar1 = this->m_numLoopIterations;
  if (this->m_numLoopIterations < 1) {
    iVar1 = 0;
  }
  local_1c4 = 0.0;
  for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    local_1c4 = local_1c4 + (float)iVar2 * 3.2 + 4.6;
  }
  local_1c4 = 1.0 / local_1c4;
  Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
            (&local_1c0,
             (_anonymous_namespace_ *)(ulong)(this->super_ShaderOptimizationCase).m_caseShaderType,
             (CaseShaderType)CONCAT71(in_register_00000011,optimized));
  if (optimized) {
    std::operator+(&local_160,"\t",&local_1c0);
    std::operator+(&local_140,&local_160," vec4 valueOrig = value;\n\t");
    std::operator+(&local_120,&local_140,&local_1c0);
    std::operator+(&local_100,&local_120,
                   " vec4 y = sin(cos(sin(valueOrig)));\n\tfor (int i = 0; i < ");
    de::toString<int>(&local_180,&this->m_numLoopIterations);
    std::operator+(&local_e0,&local_100,&local_180);
    std::operator+(&local_c0,&local_e0,"; i++)\n\t{\n\t\t");
    std::operator+(&local_a0,&local_c0,&local_1c0);
    std::operator+(&local_80,&local_a0,
                   " float x = 3.2*float(i) + 4.6;\n\t\tvalue += x*y;\n\t}\n\tvalue *= ");
    de::toString<float>(&local_1a0,&local_1c4);
    std::operator+(&local_60,&local_80,&local_1a0);
    std::operator+(&local_40,&local_60,";\n");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_100);
    this_00 = &local_120;
  }
  else {
    std::operator+(&local_160,"\t",&local_1c0);
    std::operator+(&local_140,&local_160," vec4 valueOrig = value;\n\tfor (int i = 0; i < ");
    de::toString<int>(&local_180,&this->m_numLoopIterations);
    std::operator+(&local_120,&local_140,&local_180);
    std::operator+(&local_100,&local_120,"; i++)\n\t{\n\t\t");
    std::operator+(&local_e0,&local_100,&local_1c0);
    std::operator+(&local_c0,&local_e0," float x = 3.2*float(i) + 4.6;\n\t\t");
    std::operator+(&local_a0,&local_c0,&local_1c0);
    std::operator+(&local_80,&local_a0,
                   " vec4 y = sin(cos(sin(valueOrig)));\n\t\tvalue += x*y;\n\t}\n\tvalue *= ");
    de::toString<float>(&local_1a0,&local_1c4);
    std::operator+(&local_60,&local_80,&local_1a0);
    std::operator+(&local_40,&local_60,";\n");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    this_00 = &local_180;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     &local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_1c0);
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		float scale = 0.0f;
		for (int i = 0; i < m_numLoopIterations; i++)
			scale += 3.2f*(float)i + 4.6f;
		scale = 1.0f / scale;

		const string precision		= getShaderPrecision(m_caseShaderType);
		const string statements		= optimized ?	"	" + precision + " vec4 valueOrig = value;\n"
													"	" + precision + " vec4 y = sin(cos(sin(valueOrig)));\n"
													"	for (int i = 0; i < " + toString(m_numLoopIterations) + "; i++)\n"
													"	{\n"
													"		" + precision + " float x = 3.2*float(i) + 4.6;\n"
													"		value += x*y;\n"
													"	}\n"
													"	value *= " + toString(scale) + ";\n"

												:	"	" + precision + " vec4 valueOrig = value;\n"
													"	for (int i = 0; i < " + toString(m_numLoopIterations) + "; i++)\n"
													"	{\n"
													"		" + precision + " float x = 3.2*float(i) + 4.6;\n"
													"		" + precision + " vec4 y = sin(cos(sin(valueOrig)));\n"
													"		value += x*y;\n"
													"	}\n"
													"	value *= " + toString(scale) + ";\n";

		return defaultProgramData(m_caseShaderType, statements);
	}